

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

bool R_ClipWallSegment(int first,int last,bool solid)

{
  ulong uVar1;
  bool bVar2;
  cliprange_t *pcVar3;
  int iVar4;
  cliprange_t *pcVar5;
  short sVar6;
  cliprange_t *pcVar7;
  
  pcVar3 = solidsegs;
  do {
    pcVar5 = pcVar3;
    pcVar3 = pcVar5 + 1;
  } while (pcVar5->last < first);
  iVar4 = (int)pcVar5->first;
  bVar2 = first < iVar4;
  if (first < iVar4) {
    sVar6 = (short)first;
    if (last <= iVar4) {
      R_StoreWallRange(first,last);
      if (!solid || ((byte)fake3D & 7) != 0) {
        return true;
      }
      if (pcVar5->first == last) {
        pcVar5->first = sVar6;
        return true;
      }
      pcVar7 = newend + 1;
      for (pcVar3 = newend; newend = pcVar7, pcVar5 != pcVar3; pcVar3 = pcVar3 + -1) {
        *pcVar3 = pcVar3[-1];
        pcVar7 = newend;
      }
      pcVar3->first = sVar6;
      pcVar3->last = (short)last;
      return true;
    }
    R_StoreWallRange(first,iVar4);
    if ((solid) && (((byte)fake3D & 7) == 0)) {
      pcVar5->first = sVar6;
    }
  }
  pcVar3 = pcVar5;
  if (pcVar5->last < last) {
    do {
      if (last < pcVar3[1].first) {
        R_StoreWallRange((int)pcVar3->last,last);
        pcVar7 = pcVar3;
        iVar4 = last;
        break;
      }
      pcVar7 = pcVar3 + 1;
      R_StoreWallRange((int)pcVar3->last,(int)pcVar3[1].first);
      iVar4 = (int)pcVar3[1].last;
      pcVar3 = pcVar7;
    } while (iVar4 < last);
    bVar2 = true;
    if ((solid && ((byte)fake3D & 7) == 0) && (pcVar5->last = (short)iVar4, pcVar5 != pcVar7)) {
      iVar4 = (int)((ulong)((long)newend - (long)pcVar7) >> 2);
      if (iVar4 < 1) {
        uVar1 = 1;
      }
      else {
        uVar1 = 1;
        do {
          pcVar5[uVar1] = pcVar7[uVar1];
          uVar1 = uVar1 + 1;
        } while (iVar4 + 1 != uVar1);
        uVar1 = uVar1 & 0xffffffff;
      }
      newend = pcVar5 + uVar1;
    }
  }
  return bVar2;
}

Assistant:

bool R_ClipWallSegment (int first, int last, bool solid)
{
	cliprange_t *next, *start;
	int i, j;
	bool res = false;

	// Find the first range that touches the range
	// (adjacent pixels are touching).
	start = solidsegs;
	while (start->last < first)
		start++;

	if (first < start->first)
	{
		res = true;
		if (last <= start->first)
		{
			// Post is entirely visible (above start).
			R_StoreWallRange (first, last);
			if (fake3D & FAKE3D_FAKEMASK)
			{
				return true;
			}

			// Insert a new clippost for solid walls.
			if (solid)
			{
				if (last == start->first)
				{
					start->first = first;
				}
				else
				{
					next = newend;
					newend++;
					while (next != start)
					{
						*next = *(next-1);
						next--;
					}
					next->first = first;
					next->last = last;
				}
			}
			return true;
		}

		// There is a fragment above *start.
		R_StoreWallRange (first, start->first);

		// Adjust the clip size for solid walls
		if (solid && !(fake3D & FAKE3D_FAKEMASK))
		{
			start->first = first;
		}
	}

	// Bottom contained in start?
	if (last <= start->last)
		return res;

	next = start;
	while (last >= (next+1)->first)
	{
		// There is a fragment between two posts.
		R_StoreWallRange (next->last, (next+1)->first);
		next++;
		
		if (last <= next->last)
		{
			// Bottom is contained in next.
			last = next->last;
			goto crunch;
		}
	}

	// There is a fragment after *next.
	R_StoreWallRange (next->last, last);

crunch:
	if (fake3D & FAKE3D_FAKEMASK)
	{
		return true;
	}
	if (solid)
	{
		// Adjust the clip size.
		start->last = last;

		if (next != start)
		{
			// Remove start+1 to next from the clip list,
			// because start now covers their area.
			for (i = 1, j = (int)(newend - next); j > 0; i++, j--)
			{
				start[i] = next[i];
			}
			newend = start+i;
		}
	}
	return true;
}